

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

int Io_ReadBlifNetworkConnectBoxesOne(Io_ReadBlif_t *p,Abc_Ntk_t *pNtk,stmm_table *tName2Model)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_34;
  int i;
  Abc_Obj_t *pBox;
  stmm_table *tName2Model_local;
  Abc_Ntk_t *pNtk_local;
  Io_ReadBlif_t *p_local;
  
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    if (iVar1 <= local_34) {
      Abc_NtkFinalizeRead(pNtk);
      return 0;
    }
    pObj = Abc_NtkBox(pNtk,local_34);
    iVar1 = Abc_ObjIsBlackbox(pObj);
    if ((iVar1 != 0) &&
       (iVar1 = Io_ReadBlifNetworkConnectBoxesOneBox(p,pObj,tName2Model), iVar1 != 0)) break;
    local_34 = local_34 + 1;
  }
  return 1;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOne( Io_ReadBlif_t * p, Abc_Ntk_t * pNtk, stmm_table * tName2Model )
{
    Abc_Obj_t * pBox;
    int i;
    // go through the boxes
    Abc_NtkForEachBlackbox( pNtk, pBox, i )
        if ( Io_ReadBlifNetworkConnectBoxesOneBox( p, pBox, tName2Model ) )
            return 1;
    Abc_NtkFinalizeRead( pNtk );
    return 0;
}